

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

void llvm::sys::path::native(SmallVectorImpl<char> *Path,Style style)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar7;
  char *pcVar6;
  
  uVar3 = (ulong)(Path->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  if (uVar3 != 0) {
    pcVar5 = (char *)(Path->super_SmallVectorTemplateBase<char,_true>).
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    if (style == windows) {
      uVar7 = 0;
      do {
        if (pcVar5[uVar7] == '/') {
          pcVar5[uVar7] = '\\';
        }
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
      uVar2 = (Path->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if (uVar2 == 0) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                      ,0x95,
                      "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                     );
      }
      pcVar5 = (char *)(Path->super_SmallVectorTemplateBase<char,_true>).
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      if ((*pcVar5 == '~') &&
         (((uVar2 == 1 || (cVar1 = pcVar5[1], cVar1 == '\\')) || (cVar1 == '/')))) {
        llvm_unreachable_internal
                  ("BINARYEN native",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/Path.cpp"
                   ,0x1ed);
      }
    }
    else {
      pcVar4 = pcVar5 + uVar3;
      do {
        pcVar6 = pcVar5;
        if ((*pcVar5 == '\\') && ((pcVar6 = pcVar5 + 1, pcVar4 <= pcVar6 || (*pcVar6 != '\\')))) {
          *pcVar5 = '/';
          pcVar6 = pcVar5;
        }
        pcVar5 = pcVar6 + 1;
      } while (pcVar5 < pcVar4);
    }
  }
  return;
}

Assistant:

void native(SmallVectorImpl<char> &Path, Style style) {
  if (Path.empty())
    return;
  if (real_style(style) == Style::windows) {
    std::replace(Path.begin(), Path.end(), '/', '\\');
    if (Path[0] == '~' && (Path.size() == 1 || is_separator(Path[1], style))) {
      llvm_unreachable("BINARYEN native");
#if 0
      SmallString<128> PathHome;
      home_directory(PathHome);
      PathHome.append(Path.begin() + 1, Path.end());
      Path = PathHome;
#endif
    }
  } else {
    for (auto PI = Path.begin(), PE = Path.end(); PI < PE; ++PI) {
      if (*PI == '\\') {
        auto PN = PI + 1;
        if (PN < PE && *PN == '\\')
          ++PI; // increment once, the for loop will move over the escaped slash
        else
          *PI = '/';
      }
    }
  }
}